

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes_test.cpp
# Opt level: O0

void __thiscall ParialSphere_Normal_Test::TestBody(ParialSphere_Normal_Test *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 uVar4;
  bool bVar5;
  float *pfVar6;
  float fVar7;
  float fVar8;
  undefined8 uVar12;
  Sphere *file;
  undefined1 auVar9 [64];
  undefined1 auVar13 [56];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  Point3<float> PVar14;
  Vector3<float> VVar15;
  Normal3<float> NVar16;
  Point3f PVar17;
  AssertionResult gtest_ar;
  Float dot;
  optional<pbrt::ShapeIntersection> si;
  Ray r;
  Point3f p2;
  int c_1;
  Point3f t;
  Bounds3f bbox;
  int c;
  Point3f o;
  Sphere sphere;
  Float phiMax;
  Float zMax;
  Float zMin;
  Float radius;
  Transform identity;
  RNG rng;
  int i;
  undefined4 in_stack_fffffffffffffc18;
  Float in_stack_fffffffffffffc1c;
  Transform *in_stack_fffffffffffffc20;
  Float in_stack_fffffffffffffc28;
  Float in_stack_fffffffffffffc2c;
  type in_stack_fffffffffffffc30;
  float in_stack_fffffffffffffc34;
  float in_stack_fffffffffffffc38;
  float in_stack_fffffffffffffc3c;
  Sphere *in_stack_fffffffffffffc40;
  Type in_stack_fffffffffffffc4c;
  undefined4 in_stack_fffffffffffffc50;
  Sphere *in_stack_fffffffffffffc60;
  undefined7 in_stack_fffffffffffffc98;
  float in_stack_fffffffffffffca0;
  Float in_stack_fffffffffffffca4;
  Float local_350;
  Float local_34c;
  AssertionResult local_338;
  undefined8 local_328;
  float local_320;
  undefined8 local_318;
  float local_310;
  undefined8 local_308;
  float local_300;
  undefined8 local_2f0;
  float local_2e8;
  undefined8 local_2e0;
  float local_2d8;
  undefined8 local_2d0;
  float local_2c8;
  type local_2c4;
  undefined4 local_2c0;
  optional local_2b0 [264];
  undefined8 local_1a8;
  float local_1a0;
  undefined8 local_194;
  float local_18c;
  undefined8 local_180;
  float local_178;
  undefined8 local_16c;
  Ray *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  int local_118;
  Tuple3<pbrt::Point3,_float> local_114 [3];
  int local_f0;
  Tuple3<pbrt::Point3,_float> local_ec [5];
  float local_b0;
  Float local_ac;
  Float local_a8;
  Float local_a4;
  float in_stack_ffffffffffffffd8;
  float in_stack_ffffffffffffffdc;
  char *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  int local_c;
  
  for (local_c = 0; local_c < 100; local_c = local_c + 1) {
    pbrt::RNG::RNG((RNG *)in_stack_fffffffffffffc20,
                   CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
    pbrt::Transform::Transform(in_stack_fffffffffffffc20);
    local_a4 = pExp((RNG *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc1c);
    fVar7 = pbrt::RNG::Uniform<float>((RNG *)in_stack_fffffffffffffc20);
    if (0.5 <= fVar7) {
      fVar7 = pbrt::RNG::Uniform<float>((RNG *)in_stack_fffffffffffffc20);
      local_34c = pbrt::Lerp(fVar7,-local_a4,local_a4);
    }
    else {
      local_34c = -local_a4;
    }
    local_a8 = local_34c;
    fVar7 = pbrt::RNG::Uniform<float>((RNG *)in_stack_fffffffffffffc20);
    if (0.5 <= fVar7) {
      fVar7 = pbrt::RNG::Uniform<float>((RNG *)in_stack_fffffffffffffc20);
      local_350 = pbrt::Lerp(fVar7,-local_a4,local_a4);
    }
    else {
      local_350 = local_a4;
    }
    local_ac = local_350;
    fVar7 = pbrt::RNG::Uniform<float>((RNG *)in_stack_fffffffffffffc20);
    if (0.5 <= fVar7) {
      local_b0 = pbrt::RNG::Uniform<float>((RNG *)in_stack_fffffffffffffc20);
      local_b0 = local_b0 * 360.0;
    }
    else {
      local_b0 = 360.0;
    }
    auVar9 = ZEXT464(0);
    pbrt::Sphere::Sphere
              (in_stack_fffffffffffffc40,
               (Transform *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
               (Transform *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
               SUB41((uint)in_stack_fffffffffffffc2c >> 0x18,0),in_stack_fffffffffffffc28,
               (Float)((ulong)in_stack_fffffffffffffc20 >> 0x20),SUB84(in_stack_fffffffffffffc20,0),
               in_stack_fffffffffffffc1c);
    pbrt::Point3<float>::Point3((Point3<float> *)0x56699c);
    for (local_f0 = 0; local_f0 < 3; local_f0 = local_f0 + 1) {
      in_stack_fffffffffffffca4 = pExp((RNG *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc1c);
      pfVar6 = pbrt::Tuple3<pbrt::Point3,_float>::operator[](local_ec,local_f0);
      auVar9 = ZEXT464((uint)in_stack_fffffffffffffca4);
      *pfVar6 = in_stack_fffffffffffffca4;
    }
    pbrt::Sphere::Bounds(in_stack_fffffffffffffc60);
    pbrt::Point3<float>::Point3((Point3<float> *)0x566a25);
    for (local_118 = 0; auVar13 = auVar9._8_56_, local_118 < 3; local_118 = local_118 + 1) {
      in_stack_fffffffffffffca0 = pbrt::RNG::Uniform<float>((RNG *)in_stack_fffffffffffffc20);
      pfVar6 = pbrt::Tuple3<pbrt::Point3,_float>::operator[](local_114,local_118);
      auVar9 = ZEXT464((uint)in_stack_fffffffffffffca0);
      *pfVar6 = in_stack_fffffffffffffca0;
    }
    PVar14 = pbrt::Bounds3<float>::Lerp
                       ((Bounds3<float> *)in_stack_fffffffffffffc40,
                        (Point3f *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
    auVar9._0_8_ = PVar14.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar9._8_56_ = auVar13;
    vmovlpd_avx(auVar9._0_16_);
    VVar15 = pbrt::Point3<float>::operator-
                       ((Point3<float> *)
                        CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                        (Point3<float> *)
                        CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
    local_178 = VVar15.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar10._0_8_ = VVar15.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar10._8_56_ = auVar13;
    local_180 = vmovlpd_avx(auVar10._0_16_);
    local_16c = local_180;
    fVar7 = local_178;
    pbrt::MediumHandle::TaggedPointer
              ((MediumHandle *)in_stack_fffffffffffffc20,
               (nullptr_t)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
    pbrt::Ray::Ray((Ray *)in_stack_fffffffffffffc40,
                   (Point3f *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
                   (Vector3f *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                   in_stack_fffffffffffffc2c,(MediumHandle *)in_stack_fffffffffffffc20);
    fVar8 = pbrt::RNG::Uniform<float>((RNG *)in_stack_fffffffffffffc20);
    auVar13 = ZEXT856(0);
    if (fVar8 < 0.5) {
      VVar15 = pbrt::Normalize<float>((Vector3<float> *)in_stack_fffffffffffffc40);
      local_1a0 = VVar15.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar11._0_8_ = VVar15.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar11._8_56_ = auVar13;
      local_1a8 = vmovlpd_avx(auVar11._0_16_);
      in_stack_fffffffffffffeac = (undefined4)local_1a8;
      local_194 = local_1a8;
      local_18c = local_1a0;
    }
    uVar12 = 0;
    pbrt::Sphere::Intersect
              ((Sphere *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
               in_stack_fffffffffffffea0,fVar7);
    uVar4 = pstd::optional::operator_cast_to_bool(local_2b0);
    if ((bool)uVar4) {
      pstd::optional<pbrt::ShapeIntersection>::operator->
                ((optional<pbrt::ShapeIntersection> *)0x566c46);
      NVar16 = pbrt::Normalize<float>((Normal3<float> *)in_stack_fffffffffffffc40);
      local_2d8 = NVar16.super_Tuple3<pbrt::Normal3,_float>.z;
      in_stack_fffffffffffffc60 = (Sphere *)0x0;
      auVar3._8_8_ = uVar12;
      auVar3._0_8_ = NVar16.super_Tuple3<pbrt::Normal3,_float>._0_8_;
      local_2e0 = vmovlpd_avx(auVar3);
      local_2d0 = local_2e0;
      local_2c8 = local_2d8;
      pstd::optional<pbrt::ShapeIntersection>::operator->
                ((optional<pbrt::ShapeIntersection> *)0x566cb2);
      PVar17 = pbrt::Interaction::p((Interaction *)in_stack_fffffffffffffc20);
      fVar7 = PVar17.super_Tuple3<pbrt::Point3,_float>.z;
      file = (Sphere *)0x0;
      auVar2._8_8_ = in_stack_fffffffffffffc60;
      auVar2._0_8_ = PVar17.super_Tuple3<pbrt::Point3,_float>._0_8_;
      local_318 = vmovlpd_avx(auVar2);
      local_310 = fVar7;
      local_308 = local_318;
      local_300 = fVar7;
      pbrt::Vector3<float>::Vector3<float>
                ((Vector3<float> *)in_stack_fffffffffffffc20,
                 (Point3<float> *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
      VVar15 = pbrt::Normalize<float>((Vector3<float> *)in_stack_fffffffffffffc40);
      in_stack_fffffffffffffc34 = VVar15.super_Tuple3<pbrt::Vector3,_float>.z;
      in_stack_fffffffffffffc38 = VVar15.super_Tuple3<pbrt::Vector3,_float>.x;
      in_stack_fffffffffffffc3c = VVar15.super_Tuple3<pbrt::Vector3,_float>.y;
      auVar1._8_8_ = file;
      auVar1._0_8_ = VVar15.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      local_328 = vmovlpd_avx(auVar1);
      local_320 = in_stack_fffffffffffffc34;
      local_2f0 = local_328;
      local_2e8 = in_stack_fffffffffffffc34;
      in_stack_fffffffffffffc30 =
           pbrt::Dot<float>((Normal3<float> *)in_stack_fffffffffffffc20,
                            (Vector3<float> *)
                            CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
      local_2c4 = in_stack_fffffffffffffc30;
      testing::internal::CmpHelperFloatingPointEQ<float>
                (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
                 in_stack_ffffffffffffffd8);
      bVar5 = testing::AssertionResult::operator_cast_to_bool(&local_338);
      in_stack_fffffffffffffc2c = (Float)CONCAT13(bVar5,SUB43(in_stack_fffffffffffffc2c,0));
      in_stack_fffffffffffffc40 = file;
      if (!bVar5) {
        testing::Message::Message((Message *)CONCAT44(fVar7,in_stack_fffffffffffffc50));
        in_stack_fffffffffffffc20 =
             (Transform *)testing::AssertionResult::failure_message((AssertionResult *)0x566e2c);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)CONCAT44(fVar7,in_stack_fffffffffffffc50),
                   in_stack_fffffffffffffc4c,(char *)file,(int)in_stack_fffffffffffffc3c,
                   (char *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                   (Message *)CONCAT17(uVar4,in_stack_fffffffffffffc98));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc20);
        testing::Message::~Message((Message *)0x566e89);
        in_stack_fffffffffffffc40 = file;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x566ede);
      local_2c0 = 0;
    }
    else {
      local_2c0 = 4;
    }
    pstd::optional<pbrt::ShapeIntersection>::~optional
              ((optional<pbrt::ShapeIntersection> *)0x566ef6);
  }
  return;
}

Assistant:

TEST(ParialSphere, Normal) {
    for (int i = 0; i < 100; ++i) {
        RNG rng(i);
        Transform identity;
        Float radius = pExp(rng, 4);
        Float zMin = rng.Uniform<Float>() < 0.5
                         ? -radius
                         : Lerp(rng.Uniform<Float>(), -radius, radius);
        Float zMax = rng.Uniform<Float>() < 0.5
                         ? radius
                         : Lerp(rng.Uniform<Float>(), -radius, radius);
        Float phiMax = rng.Uniform<Float>() < 0.5 ? 360. : rng.Uniform<Float>() * 360.;
        Sphere sphere(&identity, &identity, false, radius, zMin, zMax, phiMax);

        // Ray origin
        Point3f o;
        for (int c = 0; c < 3; ++c)
            o[c] = pExp(rng);

        // Destination: a random point in the shape's bounding box.
        Bounds3f bbox = sphere.Bounds();
        Point3f t;
        for (int c = 0; c < 3; ++c)
            t[c] = rng.Uniform<Float>();
        Point3f p2 = bbox.Lerp(t);

        // Ray to intersect with the shape.
        Ray r(o, p2 - o);
        if (rng.Uniform<Float>() < .5)
            r.d = Normalize(r.d);

        // We should usually (but not always) find an intersection.
        auto si = sphere.Intersect(r, Infinity);
        if (!si)
            continue;

        Float dot = Dot(Normalize(si->intr.n), Normalize(Vector3f(si->intr.p())));
        EXPECT_FLOAT_EQ(1., dot);
    }
}